

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O0

int OPENSSL_gmtime_diff(int *out_days,int *out_secs,tm *from,tm *to)

{
  int iVar1;
  int64_t daydiff;
  int64_t timediff;
  int64_t time_from;
  int64_t time_to;
  tm *to_local;
  tm *from_local;
  int *out_secs_local;
  int *out_days_local;
  
  time_to = (int64_t)to;
  to_local = from;
  from_local = (tm *)out_secs;
  out_secs_local = out_days;
  iVar1 = OPENSSL_tm_to_posix(to,&time_from);
  if ((iVar1 != 0) && (iVar1 = OPENSSL_tm_to_posix(to_local,&timediff), iVar1 != 0)) {
    from_local->tm_sec = (int)((time_from - timediff) % 0x15180);
    *out_secs_local = (int)((time_from - timediff) / 0x15180);
    return 1;
  }
  return 0;
}

Assistant:

int OPENSSL_gmtime_diff(int *out_days, int *out_secs, const struct tm *from,
                        const struct tm *to) {
  int64_t time_to, time_from;
  if (!OPENSSL_tm_to_posix(to, &time_to) ||
      !OPENSSL_tm_to_posix(from, &time_from)) {
    return 0;
  }
  // Times are in range, so these calculations can not overflow.
  static_assert(SECS_PER_DAY <= INT_MAX, "seconds per day does not fit in int");
  static_assert((MAX_POSIX_TIME - MIN_POSIX_TIME) / SECS_PER_DAY <= INT_MAX,
                "range of valid POSIX times, in days, does not fit in int");
  int64_t timediff = time_to - time_from;
  int64_t daydiff = timediff / SECS_PER_DAY;
  timediff %= SECS_PER_DAY;
  *out_secs = (int)timediff;
  *out_days = (int)daydiff;
  return 1;
}